

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O2

int I444Scale(uint8_t *src_y,int src_stride_y,uint8_t *src_u,int src_stride_u,uint8_t *src_v,
             int src_stride_v,int src_width,int src_height,uint8_t *dst_y,int dst_stride_y,
             uint8_t *dst_u,int dst_stride_u,uint8_t *dst_v,int dst_stride_v,int dst_width,
             int dst_height,FilterMode filtering)

{
  undefined4 unaff_EBX;
  int iVar1;
  undefined1 auVar2 [16];
  
  auVar2._0_4_ = -(uint)(src_y == (uint8_t *)0x0);
  auVar2._4_4_ = -(uint)(src_u == (uint8_t *)0x0);
  auVar2._8_4_ = -(uint)(src_v == (uint8_t *)0x0);
  auVar2._12_4_ = -(uint)(dst_y == (uint8_t *)0x0);
  iVar1 = movmskps(unaff_EBX,auVar2);
  if ((dst_height < 1 ||
      (dst_width < 1 ||
      (((src_height == 0 || src_width == 0) || 0x8000 < src_height) ||
      ((dst_v == (uint8_t *)0x0 || 0x8000 < src_width) || dst_u == (uint8_t *)0x0)))) || iVar1 != 0)
  {
    iVar1 = -1;
  }
  else {
    ScalePlane(src_y,src_stride_y,src_width,src_height,dst_y,dst_stride_y,dst_width,dst_height,
               filtering);
    ScalePlane(src_u,src_stride_u,src_width,src_height,dst_u,dst_stride_u,dst_width,dst_height,
               filtering);
    ScalePlane(src_v,src_stride_v,src_width,src_height,dst_v,dst_stride_v,dst_width,dst_height,
               filtering);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int I444Scale(const uint8_t* src_y,
              int src_stride_y,
              const uint8_t* src_u,
              int src_stride_u,
              const uint8_t* src_v,
              int src_stride_v,
              int src_width,
              int src_height,
              uint8_t* dst_y,
              int dst_stride_y,
              uint8_t* dst_u,
              int dst_stride_u,
              uint8_t* dst_v,
              int dst_stride_v,
              int dst_width,
              int dst_height,
              enum FilterMode filtering) {
  if (!src_y || !src_u || !src_v || src_width == 0 || src_height == 0 ||
      src_width > 32768 || src_height > 32768 || !dst_y || !dst_u || !dst_v ||
      dst_width <= 0 || dst_height <= 0) {
    return -1;
  }

  ScalePlane(src_y, src_stride_y, src_width, src_height, dst_y, dst_stride_y,
             dst_width, dst_height, filtering);
  ScalePlane(src_u, src_stride_u, src_width, src_height, dst_u, dst_stride_u,
             dst_width, dst_height, filtering);
  ScalePlane(src_v, src_stride_v, src_width, src_height, dst_v, dst_stride_v,
             dst_width, dst_height, filtering);
  return 0;
}